

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownimporter.cpp
# Opt level: O1

void CbDebugLog(char *msg,void *userdata)

{
  char *pcVar1;
  QDebug this;
  storage_type *psVar2;
  storage_type *psVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QDebug local_40;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lcMD();
  if (((byte)lcMD::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    QMessageLogger::debug();
    this.stream = local_40.stream;
    if (msg == (char *)0x0) {
      psVar3 = (storage_type *)0x0;
    }
    else {
      psVar2 = (storage_type *)0xffffffffffffffff;
      do {
        psVar3 = psVar2 + 1;
        pcVar1 = msg + 1 + (long)psVar2;
        psVar2 = psVar3;
      } while (*pcVar1 != '\0');
    }
    QVar4.m_data = psVar3;
    QVar4.m_size = (qsizetype)&local_38;
    QString::fromUtf8(QVar4);
    QTextStream::operator<<(&(this.stream)->ts,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((local_40.stream)->space == true) {
      QTextStream::operator<<(&(local_40.stream)->ts,' ');
    }
    QDebug::~QDebug(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void CbDebugLog(const char *msg, void *userdata)
{
    Q_UNUSED(userdata);
    qCDebug(lcMD) << msg;
}